

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::VarDeclaration> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::VarDeclaration>(RecursiveDescentParser *this)

{
  uint uVar1;
  element_type *peVar2;
  element_type *__x;
  socklen_t *in_RCX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::VarDeclaration> sVar3;
  allocator local_61;
  string local_60 [32];
  undefined1 local_40 [48];
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::VarDeclaration> *pResult;
  
  local_40[0x27] = 0;
  this_local = this;
  sVar3 = std::make_shared<MyCompiler::VarDeclaration>();
  accept(in_RSI,0x1d,
         (sockaddr *)
         sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._M_pi,in_RCX);
  do {
    peVar2 = std::
             __shared_ptr_access<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    parse<MyCompiler::Ident>((RecursiveDescentParser *)local_40);
    __x = std::__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator*((__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_40);
    std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::push_back
              (&peVar2->vIdent,__x);
    std::shared_ptr<MyCompiler::Ident>::~shared_ptr((shared_ptr<MyCompiler::Ident> *)local_40);
    uVar1 = accept(in_RSI,0xf,__addr,in_RCX);
  } while ((uVar1 & 1) != 0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"semicolon or comma expected",&local_61);
  except(in_RSI,SEMICOLON,(string *)local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::VarDeclaration>)
         sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::VarDeclaration> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<VarDeclaration>();

    accept(SymbolType::VAR);
    do
        pResult->vIdent.push_back(*parse<Ident>());
    while (accept(SymbolType::COMMA));
    except(SymbolType::SEMICOLON, "semicolon or comma expected");

    return pResult;
}